

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilesystemTest.cc
# Opt level: O3

int main(int param_1,char **param_2)

{
  int *piVar1;
  __buckets_ptr pp_Var2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  const_iterator cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint fd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_t size;
  int *__pipedes;
  bool bVar9;
  string filename;
  string symlink_name;
  string data;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  undefined1 local_180 [56];
  undefined1 local_148 [40];
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [48];
  pointer local_b0;
  string local_50;
  
  piVar1 = (int *)(local_180 + 0x10);
  local_180._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,".","");
  phosg::list_directory
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e0,(string *)local_180);
  if ((int *)local_180._0_8_ != piVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  local_180._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"FilesystemTest","");
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_e0,(key_type *)local_180);
  phosg::expect_generic
            (cVar6.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur != (__node_type *)0x0,"1 != results.count(\"FilesystemTest\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x11);
  if ((int *)local_180._0_8_ != piVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  local_180._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_180,"the-test-will-fail-if-this-file-exists","");
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_e0,(key_type *)local_180);
  phosg::expect_generic
            (cVar6.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0,
             "0 != results.count(\"the-test-will-fail-if-this-file-exists\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x13);
  if ((int *)local_180._0_8_ != piVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  local_180._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,".","");
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_e0,(key_type *)local_180);
  phosg::expect_generic
            (cVar6.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0,"0 != results.count(\".\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x14);
  if ((int *)local_180._0_8_ != piVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  local_180._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"..","");
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_e0,(key_type *)local_180);
  phosg::expect_generic
            (cVar6.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0,"0 != results.count(\"..\")",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x15);
  if ((int *)local_180._0_8_ != piVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_e0);
  local_180._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"FilesystemTest-data","");
  local_148._0_8_ = (long)local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"FilesystemTest-link","");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"0123456789","");
  phosg::save_file((string *)local_180,&local_120);
  phosg::load_file((string *)local_e0,(string *)local_180);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "0123456789");
  phosg::expect_generic
            (iVar4 == 0,"\"0123456789\" != load_file(filename)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x1f);
  pp_Var2 = (__buckets_ptr)(local_e0 + 0x10);
  if ((__buckets_ptr)local_e0._0_8_ != pp_Var2) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  sVar3 = local_120._M_string_length;
  phosg::stat(local_e0,(stat *)local_180);
  phosg::expect_generic
            ((pointer)sVar3 == local_b0,"data.size() != (size_t)stat(filename).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x21);
  sVar3 = local_120._M_string_length;
  phosg::lstat(local_e0,(stat *)local_180);
  phosg::expect_generic
            ((pointer)sVar3 == local_b0,"data.size() != (size_t)lstat(filename).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x23);
  symlink((char *)local_180._0_8_,(char *)local_148._0_8_);
  sVar3 = local_120._M_string_length;
  phosg::stat(local_e0,(stat *)local_148);
  phosg::expect_generic
            ((pointer)sVar3 == local_b0,"data.size() != (size_t)stat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x27);
  phosg::lstat(local_e0,(stat *)local_148);
  phosg::expect_generic
            ((pointer)local_180._8_8_ == local_b0,
             "filename.size() != (size_t)lstat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x28);
  local_e0._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"r+b","");
  phosg::fopen_unique((phosg *)&local_100,(string *)local_180,(string *)local_e0,(FILE *)0x0);
  if ((__buckets_ptr)local_e0._0_8_ != pp_Var2) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  sVar3 = local_120._M_string_length;
  phosg::fstat((int)local_e0,(stat *)local_100._M_string_length);
  phosg::expect_generic
            ((pointer)sVar3 == local_b0,"data.size() != (size_t)fstat(f.get()).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x2d);
  sVar3 = local_120._M_string_length;
  uVar5 = fileno((FILE *)local_100._M_string_length);
  phosg::fstat((int)local_e0,(stat *)(ulong)uVar5);
  phosg::expect_generic
            ((pointer)sVar3 == local_b0,"data.size() != (size_t)fstat(fileno(f.get())).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x2e);
  fseek((FILE *)local_100._M_string_length,5,0);
  fwrite(local_120._M_dataplus._M_p,1,local_120._M_string_length,(FILE *)local_100._M_string_length)
  ;
  if ((FILE *)local_100._M_string_length != (FILE *)0x0) {
    (*(code *)local_100._M_dataplus._M_p)();
  }
  sVar3 = local_120._M_string_length;
  phosg::stat(local_e0,(stat *)local_148);
  phosg::expect_generic
            ((pointer)((long)(sVar3 + 4) + 1U) == local_b0,
             "data.size() + 5 != (size_t)stat(symlink_name).st_size",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x34);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_100,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,0,5);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_100,local_120._M_dataplus._M_p,local_120._M_string_length);
  local_e0._0_8_ = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._0_8_ == paVar8) {
    local_e0._16_8_ = paVar8->_M_allocated_capacity;
    local_e0._24_8_ = *(size_type *)((long)&pbVar7->field_2 + 8);
    local_e0._0_8_ = pp_Var2;
  }
  else {
    local_e0._16_8_ = paVar8->_M_allocated_capacity;
  }
  local_e0._8_8_ = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  phosg::load_file(&local_50,(string *)local_148);
  if (local_e0._8_8_ == local_50._M_string_length) {
    if (local_e0._8_8_ == 0) {
      bVar9 = true;
    }
    else {
      iVar4 = bcmp((void *)local_e0._0_8_,local_50._M_dataplus._M_p,local_e0._8_8_);
      bVar9 = iVar4 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  size = 0x35;
  phosg::expect_generic
            (bVar9,"data.substr(0, 5) + data != load_file(symlink_name)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x35);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((__buckets_ptr)local_e0._0_8_ != pp_Var2) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  remove((char *)local_180._0_8_);
  remove((char *)local_148._0_8_);
  if (local_148._0_8_ != (long)local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  __pipedes = (int *)local_180._0_8_;
  if ((int *)local_180._0_8_ != piVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  uVar5 = phosg::pipe(__pipedes);
  phosg::writex(fd,"omg",3);
  phosg::readx_abi_cxx11_((string *)local_e0,(phosg *)(ulong)uVar5,3,size);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "omg");
  phosg::expect_generic
            (iVar4 == 0,"\"omg\" != readx(p.first, 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x49);
  if ((__buckets_ptr)local_e0._0_8_ != pp_Var2) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  local_148._0_4_ = 0;
  local_148._4_2_ = 0;
  local_148._6_2_ = 0;
  local_148._8_8_ = (pointer)0x0;
  local_148._16_8_ = 0;
  phosg::Poll::add((Poll *)local_148,uVar5,1);
  phosg::Poll::add((Poll *)local_148,fd,4);
  local_180._4_2_ = 4;
  local_180._0_4_ = fd;
  iVar4 = 0;
  std::
  _Hashtable<int,std::pair<int_const,short>,std::allocator<std::pair<int_const,short>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<int_const,short>const*>
            ((_Hashtable<int,std::pair<int_const,short>,std::allocator<std::pair<int_const,short>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_e0,local_180,local_180 + 8,0,&local_120,&local_100,&local_50);
  phosg::Poll::poll((Poll *)local_180,(pollfd *)local_148,0,iVar4);
  bVar9 = std::__detail::
          _Equality<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::_M_equal((_Equality<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)local_e0,(__hashtable *)local_180);
  phosg::expect_generic
            (bVar9,"expected_result != poll.poll()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/FilesystemTest.cc"
             ,0x4f);
  std::
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_180);
  phosg::Poll::remove((Poll *)local_148,(char *)(ulong)uVar5);
  phosg::Poll::remove((Poll *)local_148,(char *)(ulong)fd);
  std::
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_e0);
  if ((pollfd)local_148._0_8_ != (pollfd)0x0) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ - local_148._0_8_);
  }
  puts("FilesystemTest: all tests passed");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    auto results = list_directory(".");
#ifdef PHOSG_WINDOWS
    expect_eq(1, results.count("FilesystemTest.exe"));
#else
    expect_eq(1, results.count("FilesystemTest"));
#endif
    expect_eq(0, results.count("the-test-will-fail-if-this-file-exists"));
    expect_eq(0, results.count("."));
    expect_eq(0, results.count(".."));
  }

  {
    string filename("FilesystemTest-data");
    string symlink_name("FilesystemTest-link");
    try {
      string data("0123456789");

      save_file(filename, data);
      expect_eq("0123456789", load_file(filename));

      expect_eq(data.size(), (size_t)stat(filename).st_size);
#ifndef PHOSG_WINDOWS
      expect_eq(data.size(), (size_t)lstat(filename).st_size);

      symlink(filename.c_str(), symlink_name.c_str());

      expect_eq(data.size(), (size_t)stat(symlink_name).st_size);
      expect_eq(filename.size(), (size_t)lstat(symlink_name).st_size);
#endif

      {
        auto f = fopen_unique(filename, "r+b");
        expect_eq(data.size(), (size_t)fstat(f.get()).st_size);
        expect_eq(data.size(), (size_t)fstat(fileno(f.get())).st_size);
        fseek(f.get(), 5, SEEK_SET);
        fwrite(data.data(), 1, data.size(), f.get());
      }

#ifndef PHOSG_WINDOWS
      expect_eq(data.size() + 5, (size_t)stat(symlink_name).st_size);
      expect_eq(data.substr(0, 5) + data, load_file(symlink_name));
#endif

    } catch (...) {
      remove(filename.c_str());
#ifndef PHOSG_WINDOWS
      remove(symlink_name.c_str());
#endif
      throw;
    }
    remove(filename.c_str());
#ifndef PHOSG_WINDOWS
    remove(symlink_name.c_str());
#endif
  }

#ifndef PHOSG_WINDOWS
  {
    auto p = pipe();
    writex(p.second, "omg", 3);
    expect_eq("omg", readx(p.first, 3));

    Poll poll;
    poll.add(p.first, POLLIN);
    poll.add(p.second, POLLOUT);
    unordered_map<int, short> expected_result({{p.second, POLLOUT}});
    expect_eq(expected_result, poll.poll());
    poll.remove(p.first, true);
    poll.remove(p.second, true);
  }
#endif

  // TODO: test get_user_home_directory

  printf("FilesystemTest: all tests passed\n");
  return 0;
}